

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_conversions.h
# Opt level: O2

uint mjs::unicode::utf16_code_unit_count(char32_t code_point)

{
  uint uVar1;
  
  if ((uint)code_point < 0xd800) {
    return 1;
  }
  uVar1 = 0;
  if ((0xdfff < (uint)code_point) && (uVar1 = 1, 0xffff < (uint)code_point)) {
    uVar1 = (uint)((uint)code_point < 0x110000) * 2;
  }
  return uVar1;
}

Assistant:

constexpr unsigned utf16_code_unit_count(char32_t code_point) {
    return code_point < utf16_high_surrogate ? 1 :
           code_point <= utf16_last_surrogate ? invalid_length :
           code_point < 0x10000 ? 1 :
           code_point < max_code_point ? 2 : invalid_length;
}